

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O0

char * httplib::detail::find_content_type
                 (string *path,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *user_data)

{
  bool bVar1;
  uint uVar2;
  _Self local_60 [3];
  _Self local_48;
  const_iterator it;
  string ext;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *user_data_local;
  string *path_local;
  
  file_extension((string *)&it,path);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(user_data,(string *)&it);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(user_data);
  bVar1 = std::operator!=(&local_48,local_60);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_48);
    path_local = (string *)std::__cxx11::string::c_str();
    goto LAB_00157a81;
  }
  uVar2 = str2tag((string *)&it);
  if (uVar2 == 0x76d) {
    path_local = (string *)anon_var_dwarf_5a36c;
    goto LAB_00157a81;
  }
  if (uVar2 == 0xd3d) {
    path_local = (string *)anon_var_dwarf_5a3ba;
    goto LAB_00157a81;
  }
  if (uVar2 != 0xdd9) {
    if (uVar2 == 0x1a2c3) {
      path_local = (string *)anon_var_dwarf_5a234;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1a2c6) {
      path_local = (string *)anon_var_dwarf_5a241;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1a6df) {
      path_local = (string *)anon_var_dwarf_5a282;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1b0f1) {
LAB_0015775c:
      path_local = (string *)anon_var_dwarf_5a25b;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1b288) {
      path_local = (string *)anon_var_dwarf_5a28f;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1c97d) {
LAB_00157859:
      path_local = (string *)anon_var_dwarf_5a2d0;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1cb45) {
      path_local = (string *)anon_var_dwarf_5a2b6;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1d0f2) {
      path_local = (string *)anon_var_dwarf_5a386;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1d1b9) {
      path_local = (string *)anon_var_dwarf_5a29c;
      goto LAB_00157a81;
    }
    if (uVar2 == 0x1d5fd) {
      path_local = (string *)anon_var_dwarf_5a338;
      goto LAB_00157a81;
    }
    if (uVar2 != 0x1db34) {
      if (uVar2 == 0x1de29) {
        path_local = (string *)anon_var_dwarf_5a2dd;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1de2e) {
        path_local = (string *)anon_var_dwarf_5a304;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1dee6) {
        path_local = (string *)anon_var_dwarf_5a345;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1e078) {
        path_local = (string *)anon_var_dwarf_5293b;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1e147) {
        path_local = (string *)anon_var_dwarf_5a3a0;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1e25b) {
        path_local = (string *)anon_var_dwarf_5a2c3;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1e322) {
        path_local = (string *)anon_var_dwarf_574ba;
        goto LAB_00157a81;
      }
      if (uVar2 == 0x1e692) {
        path_local = (string *)anon_var_dwarf_5a393;
        goto LAB_00157a81;
      }
      if (uVar2 != 0x1f164) {
        if (uVar2 == 0x1f1d9) {
          path_local = (string *)anon_var_dwarf_574e1;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x1f580) {
          path_local = (string *)anon_var_dwarf_5a32b;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x1f7f6) {
          path_local = (string *)anon_var_dwarf_5a24e;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x20a43) {
          path_local = (string *)anon_var_dwarf_5a3c7;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x371b38) {
          path_local = (string *)anon_var_dwarf_5a268;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x372318) {
          path_local = (string *)anon_var_dwarf_5a275;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x372b57) {
          path_local = (string *)anon_var_dwarf_5a379;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x37cf7d) goto LAB_0015775c;
        if (uVar2 == 0x3adb38) {
          path_local = (string *)anon_var_dwarf_574d4;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x3af938) goto LAB_00157859;
        if (uVar2 == 0x3dad1f) {
          path_local = (string *)anon_var_dwarf_5a2ea;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x3daddb) {
          path_local = (string *)anon_var_dwarf_5a311;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x3e2ddd) {
          path_local = (string *)anon_var_dwarf_5a2c3;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x3ff093) {
          path_local = (string *)anon_var_dwarf_5a3ad;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x409760) {
          path_local = (string *)anon_var_dwarf_5a2a9;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x409771) {
          path_local = (string *)anon_var_dwarf_5a31e;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x40977d) {
          path_local = (string *)anon_var_dwarf_5a2f7;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x40a648) {
          path_local = (string *)anon_var_dwarf_5a3d4;
          goto LAB_00157a81;
        }
        if (uVar2 == 0x40c278) {
          path_local = (string *)anon_var_dwarf_5a352;
          goto LAB_00157a81;
        }
        if (uVar2 != 0x843cec5) {
          if (uVar2 == 0x859114a) {
            path_local = (string *)anon_var_dwarf_5a35f;
          }
          else {
            path_local = (string *)0x0;
          }
          goto LAB_00157a81;
        }
      }
      path_local = (string *)anon_var_dwarf_574ee;
      goto LAB_00157a81;
    }
  }
  path_local = (string *)anon_var_dwarf_574c7;
LAB_00157a81:
  std::__cxx11::string::~string((string *)&it);
  return (char *)path_local;
}

Assistant:

inline const char*
            find_content_type(const std::string& path,
                const std::map<std::string, std::string>& user_data) {
            auto ext = file_extension(path);

            auto it = user_data.find(ext);
            if (it != user_data.end()) { return it->second.c_str(); }

            using udl::operator""_;

            switch (str2tag(ext)) {
            default: return nullptr;
            case "css"_: return "text/css";
            case "csv"_: return "text/csv";
            case "txt"_: return "text/plain";
            case "vtt"_: return "text/vtt";
            case "htm"_:
            case "html"_: return "text/html";

            case "apng"_: return "image/apng";
            case "avif"_: return "image/avif";
            case "bmp"_: return "image/bmp";
            case "gif"_: return "image/gif";
            case "png"_: return "image/png";
            case "svg"_: return "image/svg+xml";
            case "webp"_: return "image/webp";
            case "ico"_: return "image/x-icon";
            case "tif"_: return "image/tiff";
            case "tiff"_: return "image/tiff";
            case "jpg"_:
            case "jpeg"_: return "image/jpeg";

            case "mp4"_: return "video/mp4";
            case "mpeg"_: return "video/mpeg";
            case "webm"_: return "video/webm";

            case "mp3"_: return "audio/mp3";
            case "mpga"_: return "audio/mpeg";
            case "weba"_: return "audio/webm";
            case "wav"_: return "audio/wave";

            case "otf"_: return "font/otf";
            case "ttf"_: return "font/ttf";
            case "woff"_: return "font/woff";
            case "woff2"_: return "font/woff2";

            case "7z"_: return "application/x-7z-compressed";
            case "atom"_: return "application/atom+xml";
            case "pdf"_: return "application/pdf";
            case "js"_:
            case "mjs"_: return "application/javascript";
            case "json"_: return "application/json";
            case "rss"_: return "application/rss+xml";
            case "tar"_: return "application/x-tar";
            case "xht"_:
            case "xhtml"_: return "application/xhtml+xml";
            case "xslt"_: return "application/xslt+xml";
            case "xml"_: return "application/xml";
            case "gz"_: return "application/gzip";
            case "zip"_: return "application/zip";
            case "wasm"_: return "application/wasm";
            }
        }